

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

void __thiscall QNetworkProxy::setType(QNetworkProxy *this,ProxyType type)

{
  Int IVar1;
  QNetworkProxyPrivate *pQVar2;
  ulong uVar3;
  
  pQVar2 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  pQVar2->type = type;
  pQVar2 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  if (pQVar2->capabilitiesSet == false) {
    uVar3 = 0;
    if (type < (HttpCachingProxy|NoProxy)) {
      uVar3 = (ulong)type;
    }
    IVar1 = (&defaultCapabilitiesForType(QNetworkProxy::ProxyType)::defaults)[uVar3];
    pQVar2 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
    (pQVar2->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
    super_QFlagsStorage<QNetworkProxy::Capability>.i = IVar1;
  }
  return;
}

Assistant:

void QNetworkProxy::setType(QNetworkProxy::ProxyType type)
{
    d->type = type;
    if (!d->capabilitiesSet)
        d->capabilities = defaultCapabilitiesForType(type);
}